

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

void __thiscall Jinx::Variant::SetCollection(Variant *this,CollectionPtr *value)

{
  bool bVar1;
  CollectionPtr *value_local;
  Variant *this_local;
  
  Destroy(this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)value);
  if (!bVar1) {
    this->m_type = Null;
    (this->field_1).m_number = 0.0;
  }
  this->m_type = Collection;
  std::
  shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
  ::shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                *)&(this->field_1).m_string);
  std::
  shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
  ::operator=((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
               *)&(this->field_1).m_string,value);
  return;
}

Assistant:

inline_t void Variant::SetCollection(const CollectionPtr & value)
	{
		Destroy();
		if (!value)
		{
			m_type = ValueType::Null;
			m_integer = 0;
		}
		m_type = ValueType::Collection;
		new(&m_collection) CollectionPtr();
		m_collection = value;
	}